

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::StartTimer(cmProcess *this)

{
  bool bVar1;
  pointer this_00;
  uint64_t timeout;
  byte local_2d;
  int local_2c;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> msec;
  cmCTestTestProperties *properties;
  cmProcess *this_local;
  
  this_00 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                      (&this->Runner);
  msec.__r = (rep)cmCTestRunTest::GetTestProperties(this_00);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,double,std::ratio<1l,1l>>
                                (&this->Timeout);
  local_2c = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_28,&local_2c);
  bVar1 = std::chrono::operator!=(&local_20,&local_28);
  local_2d = 1;
  if (!bVar1) {
    local_2d = *(byte *)(msec.__r + 0x160) ^ 0xff;
  }
  if ((local_2d & 1) != 0) {
    timeout = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
    ::cm::uv_timer_ptr::start(&this->Timer,OnTimeoutCB,timeout,0);
  }
  return;
}

Assistant:

void cmProcess::StartTimer()
{
  auto* properties = this->Runner->GetTestProperties();
  auto msec =
    std::chrono::duration_cast<std::chrono::milliseconds>(this->Timeout);

  if (msec != std::chrono::milliseconds(0) || !properties->ExplicitTimeout) {
    this->Timer.start(&cmProcess::OnTimeoutCB,
                      static_cast<uint64_t>(msec.count()), 0);
  }
}